

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O2

uint32 crnd::crnd_get_crn_format_bits_per_texel(crn_format fmt)

{
  uint32 uVar1;
  
  uVar1 = 0;
  if ((ulong)fmt < 0xf) {
    uVar1 = *(uint32 *)(&DAT_0018699c + fmt * 4);
  }
  return uVar1;
}

Assistant:

uint32 crnd_get_crn_format_bits_per_texel(crn_format fmt)
    {
        switch (fmt)
        {
            case cCRNFmtDXT1:
            case cCRNFmtDXT5A:
            case cCRNFmtETC1:
            case cCRNFmtETC2:
            case cCRNFmtETC1S:
                return 4;
            case cCRNFmtDXT3:
            case cCRNFmtDXT5:
            case cCRNFmtDXN_XY:
            case cCRNFmtDXN_YX:
            case cCRNFmtDXT5_CCxY:
            case cCRNFmtDXT5_xGxR:
            case cCRNFmtDXT5_xGBR:
            case cCRNFmtDXT5_AGBR:
            case cCRNFmtETC2A:
            case cCRNFmtETC2AS:
                return 8;
            default:
                break;
        }
        CRND_ASSERT(false);
        return 0;
    }